

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::IncompatibleFormatsCompressionTest::IncompatibleFormatsCompressionTest
          (IncompatibleFormatsCompressionTest *this,Context *context)

{
  bool bVar1;
  undefined1 local_6c [8];
  testCase test_case_1;
  undefined1 local_40 [8];
  testCase test_case;
  GLenum tex_target;
  GLuint target;
  Context *context_local;
  IncompatibleFormatsCompressionTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"incompatible_formats_compression",
             "Test verifies if INVALID_OPERATION is generated when textures provided to CopySubImageData are incompatible, one of formats is compressed"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IncompatibleFormatsCompressionTest_0322e6f8;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (test_case.m_expected_result = 0; test_case.m_expected_result < 0xb;
      test_case.m_expected_result = test_case.m_expected_result + 1) {
    test_case.m_src_type = *(GLenum *)(s_valid_targets + (ulong)test_case.m_expected_result * 4);
    if ((((test_case.m_src_type != 0xde0) && (test_case.m_src_type != 0x8c18)) &&
        (test_case.m_src_type != 0x806f)) &&
       (((test_case.m_src_type != 0x84f5 && (test_case.m_src_type != 0x8d41)) &&
        (bVar1 = Utils::isTargetMultisampled(test_case.m_src_type), !bVar1)))) {
      local_40._0_4_ = test_case.m_src_type;
      local_40._4_4_ = 0x8d70;
      test_case.m_tex_target = 0x8d99;
      test_case.m_dst_internal_format = 0x1405;
      test_case.m_dst_format = 0x8dbd;
      test_case.m_dst_type = 0x8227;
      test_case.m_src_internal_format = 0x1401;
      test_case.m_src_format = 0;
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_40);
      local_6c._0_4_ = test_case.m_src_type;
      local_6c._4_4_ = 0x8d76;
      test_case_1.m_tex_target = 0x8d99;
      test_case_1.m_dst_internal_format = 0x1403;
      test_case_1.m_dst_format = 0x8dbd;
      test_case_1.m_dst_type = 0x8227;
      test_case_1.m_src_internal_format = 0x1401;
      test_case_1.m_src_format = 0x502;
      std::
      vector<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase,_std::allocator<gl4cts::CopyImage::IncompatibleFormatsCompressionTest::testCase>_>
      ::push_back(&this->m_test_cases,(value_type *)local_6c);
    }
  }
  return;
}

Assistant:

IncompatibleFormatsCompressionTest::IncompatibleFormatsCompressionTest(deqp::Context& context)
	: TestCase(context, "incompatible_formats_compression", "Test verifies if INVALID_OPERATION is generated when "
															"textures provided to CopySubImageData are incompatible, "
															"one of formats is compressed")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		const GLenum tex_target = s_valid_targets[target];

		/* Skip 1D targets, not supported */
		if ((GL_TEXTURE_1D == tex_target) || (GL_TEXTURE_1D_ARRAY == tex_target) || (GL_TEXTURE_3D == tex_target) ||
			(GL_TEXTURE_RECTANGLE == tex_target) || (GL_RENDERBUFFER == tex_target))
		{
			continue;
		}

		/* Skip multisampled and rectangle targets */
		if (true == Utils::isTargetMultisampled(tex_target))
		{
			continue;
		}

		/* Compressed 128bit vs RGBA32UI */
		{
			testCase test_case = {
				tex_target, GL_RGBA32UI,	  GL_RGBA_INTEGER, GL_UNSIGNED_INT, GL_COMPRESSED_RG_RGTC2,
				GL_RG,		GL_UNSIGNED_BYTE, GL_NO_ERROR
			};

			m_test_cases.push_back(test_case);
		}

		/* Compressed 128bit vs RGBA16UI */
		{
			testCase test_case = {
				tex_target, GL_RGBA16UI,	  GL_RGBA_INTEGER,	 GL_UNSIGNED_SHORT, GL_COMPRESSED_RG_RGTC2,
				GL_RG,		GL_UNSIGNED_BYTE, GL_INVALID_OPERATION
			};

			m_test_cases.push_back(test_case);
		}
	}
}